

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::DiffParser::ProcessLine(DiffParser *this)

{
  char *pcVar1;
  long lVar2;
  Change local_b8;
  char *status_last;
  char *status_first;
  char *dst_sha1_last;
  char *dst_sha1_first;
  char *src_sha1_last;
  char *src_sha1_first;
  char *dst_mode_last;
  char *dst_mode_first;
  char *src_mode_last;
  char *src_mode_first;
  DiffParser *local_18;
  DiffParser *this_local;
  
  local_18 = this;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_LineParser).Line);
  if (*pcVar1 == ':') {
    this->DiffField = DiffFieldChange;
    cmCTestGlobalVC::Change::Change((Change *)&src_mode_first,'?');
    cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)&src_mode_first);
    cmCTestGlobalVC::Change::~Change((Change *)&src_mode_first);
  }
  if (this->DiffField == DiffFieldChange) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_LineParser).Line);
    if (*pcVar1 == ':') {
      lVar2 = std::__cxx11::string::c_str();
      src_mode_last = (char *)(lVar2 + 1);
      dst_mode_first = ConsumeField(this,src_mode_last);
      dst_mode_last = ConsumeSpace(this,dst_mode_first);
      src_sha1_first = ConsumeField(this,dst_mode_last);
      src_sha1_last = ConsumeSpace(this,src_sha1_first);
      dst_sha1_first = ConsumeField(this,src_sha1_last);
      dst_sha1_last = ConsumeSpace(this,dst_sha1_first);
      status_first = ConsumeField(this,dst_sha1_last);
      status_last = ConsumeSpace(this,status_first);
      pcVar1 = ConsumeField(this,status_last);
      if (status_last == pcVar1) {
        this->DiffField = DiffFieldNone;
      }
      else {
        (this->CurChange).Action = *status_last;
        this->DiffField = DiffFieldSrc;
      }
    }
    else {
      this->DiffField = DiffFieldNone;
    }
  }
  else if (this->DiffField == DiffFieldSrc) {
    if ((this->CurChange).Action == 'C') {
      (this->CurChange).Action = 'A';
      this->DiffField = DiffFieldDst;
    }
    else if ((this->CurChange).Action == 'R') {
      (this->CurChange).Action = 'D';
      std::__cxx11::string::operator=
                ((string *)&(this->CurChange).Path,(string *)&(this->super_LineParser).Line);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      cmCTestGlobalVC::Change::Change(&local_b8,'A');
      cmCTestGlobalVC::Change::operator=(&this->CurChange,&local_b8);
      cmCTestGlobalVC::Change::~Change(&local_b8);
      this->DiffField = DiffFieldDst;
    }
    else {
      std::__cxx11::string::operator=
                ((string *)&(this->CurChange).Path,(string *)&(this->super_LineParser).Line);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      this->DiffField = DiffFieldNone;
    }
  }
  else if (this->DiffField == DiffFieldDst) {
    std::__cxx11::string::operator=
              ((string *)&(this->CurChange).Path,(string *)&(this->super_LineParser).Line);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
    this->DiffField = DiffFieldNone;
  }
  return true;
}

Assistant:

bool ProcessLine() CM_OVERRIDE
  {
    if (this->Line[0] == ':') {
      this->DiffField = DiffFieldChange;
      this->CurChange = Change();
    }
    if (this->DiffField == DiffFieldChange) {
      // :src-mode dst-mode src-sha1 dst-sha1 status
      if (this->Line[0] != ':') {
        this->DiffField = DiffFieldNone;
        return true;
      }
      const char* src_mode_first = this->Line.c_str() + 1;
      const char* src_mode_last = this->ConsumeField(src_mode_first);
      const char* dst_mode_first = this->ConsumeSpace(src_mode_last);
      const char* dst_mode_last = this->ConsumeField(dst_mode_first);
      const char* src_sha1_first = this->ConsumeSpace(dst_mode_last);
      const char* src_sha1_last = this->ConsumeField(src_sha1_first);
      const char* dst_sha1_first = this->ConsumeSpace(src_sha1_last);
      const char* dst_sha1_last = this->ConsumeField(dst_sha1_first);
      const char* status_first = this->ConsumeSpace(dst_sha1_last);
      const char* status_last = this->ConsumeField(status_first);
      if (status_first != status_last) {
        this->CurChange.Action = *status_first;
        this->DiffField = DiffFieldSrc;
      } else {
        this->DiffField = DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldSrc) {
      // src-path
      if (this->CurChange.Action == 'C') {
        // Convert copy to addition of destination.
        this->CurChange.Action = 'A';
        this->DiffField = DiffFieldDst;
      } else if (this->CurChange.Action == 'R') {
        // Convert rename to deletion of source and addition of destination.
        this->CurChange.Action = 'D';
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);

        this->CurChange = Change('A');
        this->DiffField = DiffFieldDst;
      } else {
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);
        this->DiffField = this->DiffFieldNone;
      }
    } else if (this->DiffField == DiffFieldDst) {
      // dst-path
      this->CurChange.Path = this->Line;
      this->Changes.push_back(this->CurChange);
      this->DiffField = this->DiffFieldNone;
    }
    return true;
  }